

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O0

uint32_t toInt32LE(uint8_t *in)

{
  uint8_t *in_local;
  
  return *(uint32_t *)in;
}

Assistant:

static inline uint32_t toInt32LE( const uint8_t *in )
{
    return static_cast<uint32_t>( in[ 0 ] ) |
           static_cast<uint32_t>( in[ 1 ] << 8 ) |
           static_cast<uint32_t>( in[ 2 ] << 16 ) |
           static_cast<uint32_t>( in[ 3 ] << 24 );
}